

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  long lVar1;
  grasshopper_round_keys_t *subkeys;
  grasshopper_key_t *key;
  uint8_t uVar2;
  int i;
  long lVar3;
  grasshopper_w128_t *source;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  grasshopper_w128_t tmp;
  uchar newkey [32];
  uint local_bc;
  uint64_t local_68 [2];
  grasshopper_w128_t local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  source = (grasshopper_w128_t *)EVP_CIPHER_CTX_iv_noconst(ctx);
  local_bc = EVP_CIPHER_CTX_get_num(ctx);
  uVar6 = inl;
  if (inl != 0 && (local_bc & 0xf) != 0) {
    lVar5 = 0;
    do {
      out[lVar5] = *(byte *)((ulong)(local_bc & 0xf) + lVar3 + 0x198 + lVar5) ^ in[lVar5];
      lVar1 = lVar5 + 1;
      if ((local_bc + (int)lVar5 + 1 & 0xf) == 0) break;
      bVar7 = inl - 1 != lVar5;
      lVar5 = lVar1;
    } while (bVar7);
    out = out + lVar1;
    in = in + lVar1;
    local_bc = local_bc + (int)lVar1;
    uVar6 = inl - lVar1;
  }
  if (0xf < uVar6) {
    subkeys = (grasshopper_round_keys_t *)(lVar3 + 0x48);
    key = (grasshopper_key_t *)(lVar3 + 0x28);
    uVar4 = 0;
    do {
      if (*(int *)(lVar3 + 0x1a8) - 1U < local_bc) {
        lVar5 = 0;
        do {
          grasshopper_encrypt_block
                    (subkeys,(grasshopper_w128_t *)(ACPKM_D_2018 + lVar5),
                     (grasshopper_w128_t *)((long)&local_58 + lVar5),
                     (grasshopper_w128_t *)(lVar3 + 0x188));
          lVar5 = lVar5 + 0x10;
        } while (lVar5 == 0x10);
        *(undefined8 *)(lVar3 + 0x38) = local_48;
        *(undefined8 *)(lVar3 + 0x40) = uStack_40;
        (key->k).q[0] = local_58.q[0];
        *(uint64_t *)(lVar3 + 0x30) = local_58.q[1];
        grasshopper_set_encrypt_key(subkeys,key);
        grasshopper_set_decrypt_key((grasshopper_round_keys_t *)(lVar3 + 0xe8),key);
        local_bc = local_bc & 0xf;
      }
      grasshopper_encrypt_block
                (subkeys,source,(grasshopper_w128_t *)(lVar3 + 0x198),
                 (grasshopper_w128_t *)(lVar3 + 0x188));
      local_68[0] = ((grasshopper_w128_t *)(lVar3 + 0x198))->q[0];
      local_68[1] = *(undefined8 *)(lVar3 + 0x1a0);
      lVar5 = 0;
      do {
        local_68[lVar5] = local_68[lVar5] ^ *(ulong *)(in + lVar5 * 8);
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      lVar5 = 0;
      do {
        *(uint64_t *)(out + lVar5 * 8) = local_68[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      lVar5 = 0xf;
      do {
        uVar2 = source->b[lVar5];
        source->b[lVar5] = uVar2 + '\x01';
        bVar7 = lVar5 == 0;
        lVar5 = lVar5 + -1;
        if (bVar7) break;
      } while ((uint8_t)(uVar2 + '\x01') == '\0');
      in = in + 0x10;
      out = out + 0x10;
      local_bc = local_bc + 0x10;
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar6 >> 4);
    uVar6 = (ulong)((uint)uVar6 & 0xf);
  }
  if (uVar6 != 0) {
    if (*(int *)(lVar3 + 0x1a8) - 1U < local_bc) {
      lVar5 = 0;
      do {
        grasshopper_encrypt_block
                  ((grasshopper_round_keys_t *)(lVar3 + 0x48),
                   (grasshopper_w128_t *)(ACPKM_D_2018 + lVar5),
                   (grasshopper_w128_t *)((long)&local_58 + lVar5),
                   (grasshopper_w128_t *)(lVar3 + 0x188));
        lVar5 = lVar5 + 0x10;
      } while (lVar5 == 0x10);
      *(undefined8 *)(lVar3 + 0x38) = local_48;
      *(undefined8 *)(lVar3 + 0x40) = uStack_40;
      *(uint64_t *)(lVar3 + 0x28) = local_58.q[0];
      *(uint64_t *)(lVar3 + 0x30) = local_58.q[1];
      grasshopper_set_encrypt_key
                ((grasshopper_round_keys_t *)(lVar3 + 0x48),(grasshopper_key_t *)(lVar3 + 0x28));
      grasshopper_set_decrypt_key
                ((grasshopper_round_keys_t *)(lVar3 + 0xe8),(grasshopper_key_t *)(lVar3 + 0x28));
      local_bc = local_bc & 0xf;
    }
    grasshopper_encrypt_block
              ((grasshopper_round_keys_t *)(lVar3 + 0x48),source,
               (grasshopper_w128_t *)(lVar3 + 0x198),(grasshopper_w128_t *)(lVar3 + 0x188));
    lVar5 = 0;
    do {
      out[lVar5] = in[lVar5] ^ ((grasshopper_w128_t *)(lVar3 + 0x198))->b[lVar5];
      lVar5 = lVar5 + 1;
    } while (uVar6 + (uVar6 == 0) != lVar5);
    lVar3 = 0xf;
    do {
      uVar2 = source->b[lVar3];
      source->b[lVar3] = uVar2 + '\x01';
      bVar7 = lVar3 == 0;
      lVar3 = lVar3 + -1;
      if (bVar7) break;
    } while ((uint8_t)(uVar2 + '\x01') == '\0');
    local_bc = local_bc + (int)uVar6;
  }
  EVP_CIPHER_CTX_set_num(ctx,local_bc);
  return (int)inl;
}

Assistant:

static int gost_grasshopper_cipher_do_ctracpkm(EVP_CIPHER_CTX *ctx,
                                               unsigned char *out,
                                               const unsigned char *in,
                                               size_t inl)
{
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    unsigned char *iv = EVP_CIPHER_CTX_iv_noconst(ctx);
    unsigned int num = EVP_CIPHER_CTX_num(ctx);
    size_t blocks, i, lasted = inl;
    grasshopper_w128_t tmp;

    while ((num & GRASSHOPPER_BLOCK_MASK) && lasted) {
        *out++ = *in++ ^ c->partial_buffer.b[num & GRASSHOPPER_BLOCK_MASK];
        --lasted;
        num++;
    }
    blocks = lasted / GRASSHOPPER_BLOCK_SIZE;

    // full parts
    for (i = 0; i < blocks; i++) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  (grasshopper_w128_t *) & c->partial_buffer,
                                  &c->c.buffer);
        grasshopper_plus128(&tmp, &c->partial_buffer,
                            (grasshopper_w128_t *) in);
        grasshopper_copy128((grasshopper_w128_t *) out, &tmp);
        ctr128_inc(iv);
        in += GRASSHOPPER_BLOCK_SIZE;
        out += GRASSHOPPER_BLOCK_SIZE;
        num += GRASSHOPPER_BLOCK_SIZE;
        lasted -= GRASSHOPPER_BLOCK_SIZE;
    }

    // last part
    if (lasted > 0) {
        apply_acpkm_grasshopper(c, &num);
        grasshopper_encrypt_block(&c->c.encrypt_round_keys,
                                  (grasshopper_w128_t *) iv,
                                  &c->partial_buffer, &c->c.buffer);
        for (i = 0; i < lasted; i++)
            out[i] = c->partial_buffer.b[i] ^ in[i];
        ctr128_inc(iv);
        num += lasted;
    }
    EVP_CIPHER_CTX_set_num(ctx, num);

    return inl;
}